

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O0

void adios2::format::BP5Helper::GathervArraysTwoLevel
               (Comm *groupComm,Comm *groupLeaderComm,JSONProfiler *Profiler,uint64_t *MyContrib,
               size_t LocalSize,size_t *OverallRecvCounts,size_t OverallRecvCountsSize,
               uint64_t *OverallRecvBuffer,size_t DestRank)

{
  bool bVar1;
  int iVar2;
  string *in_RSI;
  size_t LocalSize_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvCounts_1;
  unsigned_long *n;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  uint64_t TotalSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvCounts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvBuffer;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffcf0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcf8;
  allocator *paVar3;
  ostream *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  JSONProfiler *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  int rankDestination;
  unsigned_long in_stack_fffffffffffffd20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  string *in_stack_fffffffffffffd28;
  JSONProfiler *in_stack_fffffffffffffd30;
  allocator local_209;
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [63];
  allocator local_1a1;
  string local_1a0 [32];
  size_type local_180;
  unsigned_long *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  size_t *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  unsigned_long *in_stack_fffffffffffffeb8;
  Comm *in_stack_fffffffffffffec0;
  allocator local_131;
  int in_stack_fffffffffffffed0;
  allocator local_109;
  string local_108 [32];
  reference local_e8;
  unsigned_long *local_e0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d0;
  long local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  allocator local_a1;
  string local_a0 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  allocator local_51;
  string local_50 [64];
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"ES_meta1",&local_51);
  profiling::JSONProfiler::Start(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd1e600);
  iVar2 = helper::Comm::Size((Comm *)0xd1e60d);
  rankDestination = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  if (1 < iVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"ES_meta1_gather",&local_a1);
    profiling::JSONProfiler::Start(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    helper::Comm::GatherValues<unsigned_long>
              ((Comm *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
               (int)((ulong)in_stack_fffffffffffffd18 >> 0x20));
    iVar2 = helper::Comm::Rank((Comm *)0xd1e6c8);
    rankDestination = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    if (iVar2 == 0) {
      local_c8 = 0;
      local_d0 = &local_c0;
      local_d8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      local_e0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_fffffffffffffcf0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        rankDestination = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
        if (!bVar1) break;
        local_e8 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_d8);
        local_c8 = *local_e8 + local_c8;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_d8);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd10,
                 (size_type)in_stack_fffffffffffffd08);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd1e8a6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_c0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd1e8d0);
    helper::Comm::GathervArrays<unsigned_long>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffed0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"ES_meta1_gather",&local_109);
    profiling::JSONProfiler::Stop(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffed0,"ES_meta1",&local_131);
  profiling::JSONProfiler::Stop(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffea8,"ES_meta2",(allocator *)&stack0xfffffffffffffea7);
  profiling::JSONProfiler::Start(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffea7);
  iVar2 = helper::Comm::Rank((Comm *)0xd1ead3);
  if (iVar2 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd1eaf3);
    local_180 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_80);
    iVar2 = helper::Comm::Size((Comm *)0xd1eb15);
    if (iVar2 < 2) {
      in_stack_fffffffffffffd00 = std::operator<<((ostream *)&std::cout,"This should never happen");
      std::ostream::operator<<(in_stack_fffffffffffffd00,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"ES_meta2_gather",&local_1a1);
      profiling::JSONProfiler::Start(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      helper::Comm::GatherValues<unsigned_long>
                ((Comm *)in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,rankDestination);
      this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xfffffffffffffe88;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00,
                 in_stack_fffffffffffffcf8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00)
      ;
      in_stack_fffffffffffffd30 =
           (JSONProfiler *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd1ebf4);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xd1ec10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this);
      helper::Comm::GathervArrays<unsigned_long>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 in_stack_fffffffffffffed0);
      paVar3 = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"ES_meta2_gather",paVar3);
      profiling::JSONProfiler::Stop(in_stack_fffffffffffffd30,local_10);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      in_stack_fffffffffffffd28 = local_10;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00);
  }
  paVar3 = &local_209;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"ES_meta2",paVar3);
  profiling::JSONProfiler::Stop(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd00);
  return;
}

Assistant:

void BP5Helper::GathervArraysTwoLevel(helper::Comm &groupComm, helper::Comm &groupLeaderComm,
                                      adios2::profiling::JSONProfiler &Profiler,
                                      uint64_t *MyContrib, size_t LocalSize,
                                      size_t *OverallRecvCounts, size_t OverallRecvCountsSize,
                                      uint64_t *OverallRecvBuffer, size_t DestRank)
{
    /*
     * Two-step aggregation of data that requires no intermediate processing
     */
    Profiler.Start("ES_meta1");
    std::vector<uint64_t> RecvBuffer;
    if (groupComm.Size() > 1)
    { // level 1
        Profiler.Start("ES_meta1_gather");
        std::vector<size_t> RecvCounts = groupComm.GatherValues(LocalSize, 0);
        if (groupComm.Rank() == 0)
        {
            uint64_t TotalSize = 0;
            for (auto &n : RecvCounts)
                TotalSize += n;
            RecvBuffer.resize(TotalSize);
            /*std::cout << "MD Lvl-1: rank " << m_Comm.Rank() << " gather "
                      << TotalSize << " bytes from aggregator group"
                      << std::endl;*/
        }
        groupComm.GathervArrays(MyContrib, LocalSize, RecvCounts.data(), RecvCounts.size(),
                                RecvBuffer.data(), 0);
        Profiler.Stop("ES_meta1_gather");
    } // level 1
    Profiler.Stop("ES_meta1");
    Profiler.Start("ES_meta2");
    // level 2
    if (groupComm.Rank() == 0)
    {
        std::vector<size_t> RecvCounts;
        size_t LocalSize = RecvBuffer.size();
        if (groupLeaderComm.Size() > 1)
        {
            Profiler.Start("ES_meta2_gather");
            RecvCounts = groupLeaderComm.GatherValues(LocalSize, 0);
            groupLeaderComm.GathervArrays(RecvBuffer.data(), LocalSize, RecvCounts.data(),
                                          RecvCounts.size(), OverallRecvBuffer, 0);
            Profiler.Stop("ES_meta2_gather");
        }
        else
        {
            std::cout << "This should never happen" << std::endl;
        }
    } // level 2
    Profiler.Stop("ES_meta2");
}